

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintScriptStyle(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  int iVar1;
  uint uVar2;
  int iVar3;
  Bool BVar4;
  AttVal *pAVar5;
  ctmbstr ptVar6;
  Node *pNVar7;
  Lexer *node_00;
  uint indent_00;
  uint extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar8;
  byte bVar9;
  Lexer *node_01;
  bool bVar10;
  Lexer *local_58;
  char *local_48;
  
  pprint = &doc->pprint;
  iVar1 = *(int *)((doc->config).value + 0x62);
  pNVar7 = node;
  do {
    if ((pNVar7->tag != (Dict *)0x0) && (pNVar7->tag->id == TidyTag_HEAD)) {
      prvTidyPFlushLineSmart(doc,indent);
      break;
    }
    pNVar7 = pNVar7->parent;
  } while (pNVar7 != (Node *)0x0);
  PCondFlushLineSmart(doc,indent);
  node_00 = (Lexer *)node;
  PPrintTag(doc,mode,indent,node);
  uVar8 = extraout_RDX;
  if (node->content != (Node *)0x0) {
    prvTidyPFlushLineSmart(doc,indent);
    uVar8 = extraout_RDX_00;
  }
  indent_00 = (uint)uVar8;
  if (iVar1 == 0) {
    bVar9 = 0;
    local_48 = "";
    local_58 = (Lexer *)0x184211;
  }
  else {
    if (node->content == (Node *)0x0) goto LAB_0014c427;
    pAVar5 = prvTidyAttrGetById(node,TidyAttr_TYPE);
    local_48 = "";
    local_58 = (Lexer *)0x184211;
    if ((pAVar5 != (AttVal *)0x0) && (pAVar5->value != (ctmbstr)0x0)) {
      iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"text/javascript");
      if (iVar3 == 0) {
        local_58 = (Lexer *)"//";
      }
      else if (pAVar5->value == (ctmbstr)0x0) {
        local_58 = (Lexer *)0x184211;
      }
      else {
        iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"text/css");
        if (iVar3 == 0) {
          local_58 = (Lexer *)0x185928;
          local_48 = "*/";
        }
        else {
          local_58 = (Lexer *)0x184211;
          if (pAVar5->value != (ctmbstr)0x0) {
            iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"text/vbscript");
            node_00 = (Lexer *)0x1aec84;
            local_48 = "";
            local_58 = node_00;
            if (iVar3 != 0) {
              node_00 = (Lexer *)0x184211;
              local_58 = node_00;
            }
          }
        }
      }
    }
    pNVar7 = node->content;
    if (pNVar7->type == TextNode) {
      node_00 = doc->lexer;
      ptVar6 = prvTidytmbsubstrn(node_00->lexbuf + pNVar7->start,(pNVar7->end - pNVar7->start) + 1,
                                 "<![CDATA[");
      bVar9 = 1;
      uVar8 = extraout_RDX_01;
      if (ptVar6 != (ctmbstr)0x0) goto LAB_0014c312;
    }
    uVar2 = *(uint *)((doc->config).value + 0x5d);
    prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
    AddString(pprint,(ctmbstr)local_58);
    AddString(pprint,"<![CDATA[");
    AddString(pprint,local_48);
    PCondFlushLineSmart(doc,indent);
    prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar2);
    bVar9 = 0;
    uVar8 = extraout_RDX_02;
  }
LAB_0014c312:
  node_01 = (Lexer *)node->content;
  if (node_01 == (Lexer *)0x0) {
    pNVar7 = (Node *)0x0;
  }
  else {
    iVar3 = -1;
    do {
      node_00 = node_01;
      prvTidyPPrintTree(doc,mode | 0x19,indent,(Node *)node_01);
      uVar8 = extraout_RDX_03;
      if (node_01 == (Lexer *)node->last) {
        iVar3 = TextEndsWithNewline(doc->lexer,(Node *)node_01,0x10);
        uVar8 = extraout_RDX_04;
      }
      node_01 = *(Lexer **)&node_01->insertspace;
    } while (node_01 != (Lexer *)0x0);
    pNVar7 = node->content;
    if (iVar3 < 0) {
      if (pNVar7 == (Node *)0x0) {
        pNVar7 = (Node *)0x0;
      }
      else {
        PCondFlushLineSmart(doc,indent);
        pNVar7 = node->content;
        uVar8 = extraout_RDX_05;
      }
    }
  }
  bVar10 = pNVar7 == (Node *)0x0;
  indent_00 = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),bVar10);
  node_00 = (Lexer *)CONCAT71((int7)((ulong)node_00 >> 8),iVar1 == 0 | bVar9 | bVar10);
  if ((iVar1 != 0 && bVar9 == 0) && !bVar10) {
    uVar2 = *(uint *)((doc->config).value + 0x5d);
    prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
    AddString(pprint,(ctmbstr)local_58);
    AddString(pprint,"]]>");
    AddString(pprint,local_48);
    prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar2);
    PCondFlushLineSmart(doc,indent);
    pNVar7 = node->content;
    indent_00 = extraout_EDX;
  }
  if ((pNVar7 != (Node *)0x0) && ((doc->pprint).indent[0].spaces != indent)) {
    (doc->pprint).indent[0].spaces = indent;
  }
LAB_0014c427:
  PPrintEndTag(doc,(uint)node->element,indent_00,(Node *)node_00);
  if ((((*(int *)((doc->config).value + 0x25) == 0) && (node->next != (Node *)0x0)) &&
      (BVar4 = prvTidynodeHasCM(node,0x10), BVar4 == no)) &&
     (BVar4 = prvTidynodeIsText(node), BVar4 == no)) {
    prvTidyPFlushLineSmart(doc,indent);
    return;
  }
  return;
}

Assistant:

static
void PPrintScriptStyle( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Node*   content;
    ctmbstr commentStart = DEFAULT_COMMENT_START;
    ctmbstr commentEnd = DEFAULT_COMMENT_END;
    Bool    hasCData = no;
    int     contentIndent = -1;
    Bool    xhtmlOut = cfgBool( doc, TidyXhtmlOut );

    if ( InsideHead(doc, node) )
      TY_(PFlushLineSmart)( doc, indent );

    PCondFlushLineSmart( doc, indent );  /* Issue #56 - long oustanding bug - flush any existing closing tag */

    PPrintTag( doc, mode, indent, node );

    /* SCRIPT may have no content such as when loading code via its SRC attribute.
       In this case we don't want to flush the line, preferring to keep the required
       closing SCRIPT tag on the same line. */
    if ( node->content != NULL )
        TY_(PFlushLineSmart)(doc, indent);

    if ( xhtmlOut && node->content != NULL )
    {
        AttVal* type = attrGetTYPE(node);

        if (AttrValueIs(type, "text/javascript"))
        {
            commentStart = JS_COMMENT_START;
            commentEnd = JS_COMMENT_END;
        }
        else if (AttrValueIs(type, "text/css"))
        {
            commentStart = CSS_COMMENT_START;
            commentEnd = CSS_COMMENT_END;
        }
        else if (AttrValueIs(type, "text/vbscript"))
        {
            commentStart = VB_COMMENT_START;
            commentEnd = VB_COMMENT_END;
        }

        hasCData = HasCDATA(doc->lexer, node->content);

        if (!hasCData)
        {
            uint saveWrap = WrapOff( doc );

            AddString( pprint, commentStart );
            AddString( pprint, CDATA_START );
            AddString( pprint, commentEnd );
            PCondFlushLineSmart( doc, indent );

            WrapOn( doc, saveWrap );
        }
    }

    for ( content = node->content;
          content != NULL;
          content = content->next )
    {
        /*
          This is a bit odd, with the current code there can only
          be one child and the only caller of this function defines
          all these modes already...
        */
        TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP | CDATA), 
                         indent, content );

        if ( content == node->last )
            contentIndent = TextEndsWithNewline( doc->lexer, content, CDATA );
    }

    /* Only flush the line if these was content present so that the closing
       SCRIPT tag will stay on the same line. */
    if ( contentIndent < 0 && node->content != NULL )
    {
        PCondFlushLineSmart( doc, indent );
        contentIndent = 0;
    }

    if ( xhtmlOut && node->content != NULL )
    {
        if ( ! hasCData )
        {
            uint saveWrap = WrapOff( doc );

            AddString( pprint, commentStart );
            AddString( pprint, CDATA_END );
            AddString( pprint, commentEnd );

            WrapOn( doc, saveWrap );
            PCondFlushLineSmart( doc, indent );
        }
    }

    if ( node->content && pprint->indent[ 0 ].spaces != (int)indent )
    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
        pprint->indent[ 0 ].spaces = indent;
    }
    PPrintEndTag( doc, mode, indent, node );
    if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
         && node->next != NULL &&
         !( TY_(nodeHasCM)(node, CM_INLINE) || TY_(nodeIsText)(node) ) )
        TY_(PFlushLineSmart)( doc, indent );
}